

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
::EqualElement<char[11]>::operator()
          (void *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  allocator local_31;
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  std::__cxx11::string::string((string *)&local_30,*this,&local_31);
  __n = lhs->_M_string_length;
  if (__n == local_28) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((lhs->_M_dataplus)._M_p,local_30,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return bVar2;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const
				{
					return eq(lhs, rhs);
				}